

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_report_topo_at(REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  REF_ADJ_ITEM pRVar3;
  bool bVar4;
  REF_INT RVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  
  ref_geom = ref_grid->geom;
  uVar8 = 0xffffffff;
  if (-1 < node) {
    uVar8 = 0xffffffff;
    if (node < ref_geom->ref_adj->nnode) {
      uVar8 = (ulong)(uint)ref_geom->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar8 != -1) {
    RVar5 = ref_geom->ref_adj->item[(int)uVar8].ref;
    ref_node = ref_grid->node;
    do {
      uVar7 = RVar5 * 6;
      if (ref_geom->descr[(int)uVar7] == 1) {
        pRVar2 = ref_grid->cell[0];
        uVar9 = 0xffffffff;
        if (-1 < node) {
          uVar9 = 0xffffffff;
          if (node < pRVar2->ref_adj->nnode) {
            uVar9 = (ulong)(uint)pRVar2->ref_adj->first[(uint)node];
          }
        }
        if ((int)uVar9 == -1) {
          bVar4 = true;
        }
        else {
          RVar5 = pRVar2->ref_adj->item[(int)uVar9].ref;
          bVar4 = false;
          do {
            uVar6 = ref_cell_nodes(pRVar2,RVar5,local_a8);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x843,"ref_geom_report_topo_at",(ulong)uVar6,"edg nodes");
              return uVar6;
            }
            if (ref_geom->descr[(int)(uVar7 | 1)] == local_a8[pRVar2->node_per]) {
              bVar4 = true;
            }
            pRVar3 = pRVar2->ref_adj->item;
            iVar1 = pRVar3[(int)uVar9].next;
            uVar9 = (ulong)iVar1;
            if (uVar9 == 0xffffffffffffffff) {
              RVar5 = -1;
            }
            else {
              RVar5 = pRVar3[uVar9].ref;
            }
          } while (iVar1 != -1);
          bVar4 = !bVar4;
        }
        if (bVar4) {
          uVar6 = ref_node_location(ref_node,node);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x849,"ref_geom_report_topo_at",(ulong)uVar6,"loc");
            return uVar6;
          }
          ref_geom_tattle(ref_geom,node);
          uVar6 = ref_cell_tattle_about(pRVar2,node);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x84b,"ref_geom_report_topo_at",(ulong)uVar6,"cell tatt");
            return uVar6;
          }
        }
      }
      if (ref_geom->descr[(int)uVar7] == 2) {
        pRVar2 = ref_grid->cell[3];
        uVar9 = 0xffffffff;
        if (-1 < node) {
          uVar9 = 0xffffffff;
          if (node < pRVar2->ref_adj->nnode) {
            uVar9 = (ulong)(uint)pRVar2->ref_adj->first[(uint)node];
          }
        }
        if ((int)uVar9 == -1) {
          bVar4 = true;
        }
        else {
          RVar5 = pRVar2->ref_adj->item[(int)uVar9].ref;
          bVar4 = false;
          do {
            uVar6 = ref_cell_nodes(pRVar2,RVar5,local_a8);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x852,"ref_geom_report_topo_at",(ulong)uVar6,"tri nodes");
              return uVar6;
            }
            if (ref_geom->descr[(int)(uVar7 | 1)] == local_a8[pRVar2->node_per]) {
              bVar4 = true;
            }
            pRVar3 = pRVar2->ref_adj->item;
            iVar1 = pRVar3[(int)uVar9].next;
            uVar9 = (ulong)iVar1;
            if (uVar9 == 0xffffffffffffffff) {
              RVar5 = -1;
            }
            else {
              RVar5 = pRVar3[uVar9].ref;
            }
          } while (iVar1 != -1);
          bVar4 = !bVar4;
        }
        if (bVar4) {
          uVar7 = ref_node_location(ref_node,node);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x858,"ref_geom_report_topo_at",(ulong)uVar7,"loc");
            return uVar7;
          }
          ref_geom_tattle(ref_geom,node);
          uVar7 = ref_cell_tattle_about(pRVar2,node);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x85a,"ref_geom_report_topo_at",(ulong)uVar7,"cell tatt");
            return uVar7;
          }
        }
      }
      pRVar3 = ref_geom->ref_adj->item;
      iVar1 = pRVar3[(int)uVar8].next;
      uVar8 = (ulong)iVar1;
      if (uVar8 == 0xffffffffffffffff) {
        RVar5 = -1;
      }
      else {
        RVar5 = pRVar3[uVar8].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_report_topo_at(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT geom_item, geom;
  REF_INT cell_item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT have_match;

  each_ref_geom_having_node(ref_geom, node, geom_item, geom) {
    if (REF_GEOM_EDGE == ref_geom_type(ref_geom, geom)) {
      have_match = REF_FALSE;
      ref_cell = ref_grid_edg(ref_grid);
      each_ref_cell_having_node(ref_cell, node, cell_item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "edg nodes");
        if (ref_geom_id(ref_geom, geom) == nodes[ref_cell_id_index(ref_cell)]) {
          have_match = REF_TRUE;
        }
      }
      if (!have_match) {
        RSS(ref_node_location(ref_node, node), "loc");
        RSS(ref_geom_tattle(ref_geom, node), "geom tatt");
        RSS(ref_cell_tattle_about(ref_cell, node), "cell tatt");
      }
    }
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
      have_match = REF_FALSE;
      ref_cell = ref_grid_tri(ref_grid);
      each_ref_cell_having_node(ref_cell, node, cell_item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "tri nodes");
        if (ref_geom_id(ref_geom, geom) == nodes[ref_cell_id_index(ref_cell)]) {
          have_match = REF_TRUE;
        }
      }
      if (!have_match) {
        RSS(ref_node_location(ref_node, node), "loc");
        RSS(ref_geom_tattle(ref_geom, node), "geom tatt");
        RSS(ref_cell_tattle_about(ref_cell, node), "cell tatt");
      }
    }
  }

  return REF_SUCCESS;
}